

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall
RuntimeFunctionAnalyser::visit(RuntimeFunctionAnalyser *this,RuntimeFunctionSymbol *symbol)

{
  RuntimeFunctionSymbol *in_RSI;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *in_RDI;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *unaff_retaddr;
  shared_ptr<BlockNode> *in_stack_ffffffffffffffd8;
  undefined8 local_18;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *__x;
  
  *(undefined1 *)
   ((_Storage<TypeName,_true> *)
    &(in_RDI->
     super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
     )._M_impl._M_node.super__List_node_base + 2) = 1;
  __x = in_RDI;
  RuntimeFunctionSymbol::getArguments_abi_cxx11_(in_RSI);
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::operator=(unaff_retaddr,__x);
  RuntimeFunctionSymbol::getReturnType(in_RSI);
  std::optional<TypeName>::optional<const_TypeName_&,_true>
            ((optional<TypeName> *)in_RDI,(TypeName *)in_stack_ffffffffffffffd8);
  *(undefined8 *)
   ((_Storage<TypeName,_true> *)
    &(in_RDI->
     super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
     )._M_impl._M_node.super__List_node_base + 3) = local_18;
  RuntimeFunctionSymbol::getBody(in_RSI);
  std::shared_ptr<BlockNode>::operator=((shared_ptr<BlockNode> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void RuntimeFunctionAnalyser::visit(RuntimeFunctionSymbol& symbol)
{
  symbolValid_ = true;
  arguments_ = symbol.getArguments();
  returnType_ = symbol.getReturnType();
  body_ = symbol.getBody();
}